

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd,GlobalFederateId dest)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  FederateStates FVar2;
  route_id rVar3;
  FederateState *this_00;
  optional<helics::ActionMessage> rep;
  _Optional_payload_base<helics::ActionMessage> _Stack_e8;
  
  if ((dest.gid != -2010000000) && (dest.gid != -1700000000)) {
    (cmd->dest_id).gid = dest.gid;
    if ((dest.gid == 0) || ((this->super_BrokerBase).higher_broker_id.gid == dest.gid)) {
      (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
      return;
    }
    if ((this->super_BrokerBase).global_broker_id_local.gid == dest.gid) {
      processCommandsForCore(this,cmd);
      return;
    }
    if ((this->filterFedID)._M_i.gid == dest.gid) {
      FilterFederate::handleMessage(this->filterFed,cmd);
      return;
    }
    if ((this->translatorFedID)._M_i.gid == dest.gid) {
      TranslatorFederate::handleMessage(this->translatorFed,cmd);
      return;
    }
    bVar1 = isLocal(this,dest);
    if (!bVar1) {
      rVar3 = getRoute(this,dest);
      UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
      (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar3.rid,cmd,UNRECOVERED_JUMPTABLE);
      return;
    }
    this_00 = getFederateCore(this,dest);
    if (this_00 != (FederateState *)0x0) {
      FVar2 = FederateState::getState(this_00);
      if (FVar2 != FINISHED) {
        FederateState::addAction(this_00,cmd);
        return;
      }
      FederateState::processPostTerminationAction
                ((optional<helics::ActionMessage> *)&_Stack_e8,this_00,cmd);
      if (_Stack_e8._M_engaged == true) {
        routeMessage(this,(ActionMessage *)&_Stack_e8);
      }
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&_Stack_e8);
    }
  }
  return;
}

Assistant:

void CommonCore::routeMessage(ActionMessage& cmd, GlobalFederateId dest)
{
    if (!dest.isValid()) {
        return;
    }
    cmd.dest_id = dest;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (dest == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (dest == filterFedID) {
        filterFed->handleMessage(cmd);
    } else if (dest == translatorFedID) {
        translatorFed->handleMessage(cmd);
    } else if (isLocal(dest)) {
        auto* fed = getFederateCore(dest);
        if (fed != nullptr) {
            if (fed->getState() != FederateStates::FINISHED) {
                fed->addAction(cmd);
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(dest);
        transmit(route, cmd);
    }
}